

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.hpp
# Opt level: O2

void __thiscall
CorUnix::CSharedMemoryWaitableObject::CSharedMemoryWaitableObject
          (CSharedMemoryWaitableObject *this,CObjectType *pot,CRITICAL_SECTION *pcsObjListLock)

{
  CSharedMemoryObject::CSharedMemoryObject(&this->super_CSharedMemoryObject,pot,pcsObjListLock);
  (this->super_CSharedMemoryObject).super_CPalObjectBase.super_IPalObject._vptr_IPalObject =
       (_func_int **)&PTR_GetObjectType_0037cb00;
  this->m_pvSynchData = (VOID *)0x0;
  return;
}

Assistant:

CSharedMemoryWaitableObject(
            CObjectType *pot,
            CRITICAL_SECTION *pcsObjListLock
            )
            :
            CSharedMemoryObject(pot, pcsObjListLock),
            m_pvSynchData(NULL)
        {
        }